

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueCallbacks.cpp
# Opt level: O1

ValueCallback *
ValueCallback::findCallback
          (deque<ValueCallback_*,_std::allocator<ValueCallback_*>_> *callbacks,OIDType *oid,
          bool walk,size_t startAt,size_t *foundAt)

{
  ulong uVar1;
  _Map_pointer pppVVar2;
  _Map_pointer pppVVar3;
  _Elt_pointer ppVVar4;
  ValueCallback *pVVar5;
  bool bVar6;
  bool bVar7;
  byte bVar8;
  ValueCallback **ppVVar9;
  long lVar10;
  ValueCallback *unaff_RBX;
  ValueCallback *pVVar11;
  ulong uVar12;
  long lVar13;
  size_t i;
  bool bVar14;
  
  lVar13 = startAt * 8;
  bVar14 = false;
  do {
    pppVVar2 = (callbacks->super__Deque_base<ValueCallback_*,_std::allocator<ValueCallback_*>_>).
               _M_impl.super__Deque_impl_data._M_finish._M_node;
    pppVVar3 = (callbacks->super__Deque_base<ValueCallback_*,_std::allocator<ValueCallback_*>_>).
               _M_impl.super__Deque_impl_data._M_start._M_node;
    ppVVar4 = (callbacks->super__Deque_base<ValueCallback_*,_std::allocator<ValueCallback_*>_>).
              _M_impl.super__Deque_impl_data._M_start._M_cur;
    if (((long)(callbacks->super__Deque_base<ValueCallback_*,_std::allocator<ValueCallback_*>_>).
               _M_impl.super__Deque_impl_data._M_start._M_last - (long)ppVVar4 >> 3) +
        ((long)(callbacks->super__Deque_base<ValueCallback_*,_std::allocator<ValueCallback_*>_>).
               _M_impl.super__Deque_impl_data._M_finish._M_cur -
         (long)(callbacks->super__Deque_base<ValueCallback_*,_std::allocator<ValueCallback_*>_>).
               _M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
        ((((ulong)((long)pppVVar2 - (long)pppVVar3) >> 3) - 1) +
        (ulong)(pppVVar2 == (_Map_pointer)0x0)) * 0x40 <= startAt) {
      return (ValueCallback *)0x0;
    }
    lVar10 = (long)ppVVar4 -
             (long)(callbacks->super__Deque_base<ValueCallback_*,_std::allocator<ValueCallback_*>_>)
                   ._M_impl.super__Deque_impl_data._M_start._M_first >> 3;
    uVar1 = startAt + lVar10;
    if (uVar1 < 0x40) {
      ppVVar9 = (ValueCallback **)((long)ppVVar4 + lVar13);
    }
    else {
      uVar12 = (uVar1 >> 6) + 0xfc00000000000000;
      if (0 < (long)uVar1) {
        uVar12 = uVar1 >> 6;
      }
      ppVVar9 = pppVVar3[uVar12] + lVar10 + uVar12 * -0x40 + startAt;
    }
    pVVar5 = *ppVVar9;
    bVar6 = bVar14;
    if (bVar14) {
      if (foundAt != (size_t *)0x0) {
LAB_0010b86c:
        *foundAt = startAt;
      }
      unaff_RBX = pVVar5;
      bVar6 = bVar14;
      bVar8 = 1;
    }
    else {
      bVar7 = OIDType::equals(oid,&pVVar5->OID->super_OIDType);
      if (bVar7) {
        pVVar11 = pVVar5;
        if (walk) {
          pVVar11 = unaff_RBX;
          bVar6 = true;
        }
        unaff_RBX = pVVar11;
        bVar8 = walk * '\x03' + 1;
        if (foundAt != (size_t *)0x0 && !walk) goto LAB_0010b86c;
      }
      else {
        bVar8 = 0;
        if (walk) {
          bVar8 = OIDType::isSubTreeOf(&pVVar5->OID->super_OIDType,oid);
          if ((bool)bVar8) {
            unaff_RBX = pVVar5;
          }
          if ((foundAt != (size_t *)0x0) && ((bool)bVar8)) goto LAB_0010b86c;
        }
      }
    }
    bVar14 = bVar6;
    if ((bVar8 & 3) != 0) {
      return unaff_RBX;
    }
    startAt = startAt + 1;
    lVar13 = lVar13 + 8;
  } while( true );
}

Assistant:

ValueCallback* ValueCallback::findCallback(std::deque<ValueCallback*> &callbacks, const OIDType* const oid, bool walk, size_t startAt, size_t *foundAt){
    bool useNext = false;

    for(size_t i = startAt; i < callbacks.size(); i++){
        auto callback = callbacks[i];

        if(useNext){
            if(foundAt){
                *foundAt = i;
            }
            return callback;
        }

        if(oid->equals(callback->OID)){
            if(walk){
                useNext = true;
                continue;
            }
            if(foundAt){
                *foundAt = i;
            }
            return callback;
        }

        if(walk && callback->OID->isSubTreeOf(oid)){
            // If the oid passed in is a substring of our current callback, and it begins at the start
            if(foundAt){
                *foundAt = i;
            }
            return callback;
        }
    }
    return nullptr;
}